

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void PrintMap<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *d)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  
  for (p_Var2 = (d->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(d->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,p_Var2[2]._M_color);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  return;
}

Assistant:

void PrintMap(T &d)
{
    for(auto &&e : d)
    {
        cout << e.first << " " << e.second << ",";
    }

    cout << endl;
}